

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::CopyBLAS
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,CopyBLASAttribs *Attribs,
          int param_2)

{
  String *__return_storage_ptr__;
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  Char *pCVar3;
  RenderDeviceVkImpl *pRVar4;
  DeviceFeatures *pDVar5;
  RenderPassVkImpl *pRVar6;
  COMMAND_QUEUE_TYPE Type;
  char (*in_R9) [8];
  undefined1 local_110 [8];
  string msg_5;
  string msg_4;
  string msg_3;
  undefined1 local_90 [8];
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  CopyBLASAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)local_40,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"CopyBLAS",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x7a4);
      std::__cxx11::string::~string((string *)local_40);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a4);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_COMPUTE);
  if (CVar2 != COMMAND_QUEUE_TYPE_COMPUTE) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[9],char[22],std::__cxx11::string,char[8]>
              ((string *)local_90,(Diligent *)"CopyBLAS",(char (*) [9])0xcc2999,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a4);
    std::__cxx11::string::~string((string *)local_90);
  }
  pRVar4 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->(&this->m_pDevice);
  pDVar5 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetFeatures
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRVar4);
  if (pDVar5->RayTracing == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[70]>
              ((string *)((long)&msg_4.field_2 + 8),
               (char (*) [70])
               "IDeviceContext::CopyBLAS: ray tracing is not supported by this device");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a5);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  pRVar6 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar6 != (RenderPassVkImpl *)0x0) {
    FormatString<char[74]>
              ((string *)((long)&msg_5.field_2 + 8),
               (char (*) [74])
               "IDeviceContext::CopyBLAS command must be performed outside of render pass");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a6);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderDeviceVkImpl_
                     ((RefCntAutoPtr *)&this->m_pDevice);
  bVar1 = VerifyCopyBLASAttribs((IRenderDevice *)pRVar4,Attribs);
  if (!bVar1) {
    FormatString<char[28]>((string *)local_110,(char (*) [28])"CopyBLASAttribs are invalid");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CopyBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x7a7);
    std::__cxx11::string::~string((string *)local_110);
  }
  (this->m_Stats).CommandCounters.CopyBLAS = (this->m_Stats).CommandCounters.CopyBLAS + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::CopyBLAS(const CopyBLASAttribs& Attribs, int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_COMPUTE, "CopyBLAS");
    DEV_CHECK_ERR(m_pDevice->GetFeatures().RayTracing, "IDeviceContext::CopyBLAS: ray tracing is not supported by this device");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "IDeviceContext::CopyBLAS command must be performed outside of render pass");
    DEV_CHECK_ERR(VerifyCopyBLASAttribs(m_pDevice, Attribs), "CopyBLASAttribs are invalid");

    ++m_Stats.CommandCounters.CopyBLAS;
}